

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

void __thiscall avro::anon_unknown_3::FileBufferCopyIn::seek(FileBufferCopyIn *this,size_t len)

{
  __off_t _Var1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int *piVar2;
  __off_t in_RSI;
  long in_RDI;
  off_t r;
  char **in_stack_fffffffffffffed8;
  format *in_stack_ffffffffffffff18;
  Exception *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff48;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  
  _Var1 = lseek(*(int *)(in_RDI + 8),in_RSI,1);
  if (_Var1 == -1) {
    this_00 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    piVar2 = __errno_location();
    strerror(*piVar2);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (this_00,in_stack_fffffffffffffed8);
    Exception::Exception(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void seek(size_t len) {
        off_t r = ::lseek(fd_, len, SEEK_CUR);
        if (r == static_cast<off_t>(-1)) {
            throw Exception(boost::format("Cannot skip file: %1%") %
                strerror(errno));
        }
    }